

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,16,Eigen::Stride<0,0>>const>,Eigen::internal::sub_assign_op<float,float>>
               (Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
                     *src,sub_assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_78;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  local_60;
  SrcEvaluatorType local_40;
  
  local_40.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  .m_functor.m_other = (src->m_lhs).m_functor.m_other;
  local_40.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
  .m_d.rhsImpl.
  super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_data = *(PointerType *)&src->m_rhs;
  local_40.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
  .m_d.rhsImpl.
  super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value = *(long *)&(src->m_rhs).field_0x8;
  resize_if_allowed<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,16,Eigen::Stride<0,0>>const>,Eigen::internal::sub_assign_op<float,float>>
            (dst,src,func);
  local_78.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_data = (dst->
            super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_0>
            .m_data;
  local_78.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value =
       ((*(XprTypeNested *)
          ((long)&(dst->
                  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                  ).
                  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,__1,_1,_true,_true>
                  .m_xpr.
                  super_BlockImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
                  .m_xpr.
                  super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
          + 0x18))->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
       m_rows;
  local_60.m_dst = &local_78;
  local_60.m_src = &local_40;
  local_60.m_functor = func;
  local_60.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_16,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_3,_0>
  ::run(&local_60);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}